

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O0

void __thiscall FIR::stopband(FIR *this,int M,double f1,double f2)

{
  int iVar1;
  int iVar2;
  FIR *in_RDI;
  double in_XMM0_Qa;
  FIR *in_XMM1_Qa;
  int i;
  int M_1;
  int in_stack_ffffffffffffffbc;
  char a;
  FIR *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffdc;
  
  setTaps(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  a = (char)((uint)in_stack_ffffffffffffffbc >> 0x18);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)in_XMM1_Qa,
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if ((((in_XMM0_Qa < 0.0) || (0.5 < in_XMM0_Qa)) || ((double)in_XMM1_Qa < 0.0)) ||
     (0.5 < (double)in_XMM1_Qa)) {
    printf("\nThe frequencies are not normalized\n");
  }
  else {
    setFreq(in_XMM1_Qa,(double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (int)((ulong)in_RDI >> 0x20));
    setFreq(in_XMM1_Qa,(double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (int)((ulong)in_RDI >> 0x20));
    setType(in_stack_ffffffffffffffc0,a);
    iVar1 = getTaps(in_RDI);
    iVar2 = -(iVar1 / 2);
    while (iVar2 < iVar1 / 2) {
      if (iVar2 == 0) {
        setCoeff(in_RDI,(double)(ulong)in_stack_ffffffffffffffc8,
                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        iVar3 = iVar2;
      }
      else {
        iVar3 = iVar2;
        in_stack_ffffffffffffffc0 = (FIR *)sin(in_XMM0_Qa * 6.283185307179586 * (double)iVar2);
        sin((double)in_XMM1_Qa * 6.283185307179586 * (double)iVar3);
        setCoeff(in_RDI,(double)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      }
      iVar2 = iVar3 + 1;
    }
  }
  return;
}

Assistant:

void FIR::stopband(int M, double f1, double f2){

	this->setTaps(M);

	freq.resize(2);

	if (f1<0.0 or f1>0.5 or f2<0.0 or f2>0.5){printf("\nThe frequencies are not normalized\n");}
	else{
		this->setFreq(f1,0);
		this->setFreq(f2,1);
		this->setType('s');
		int M=this->getTaps();
		
		for (int i=-int(M/2); i<int(M/2); i++){
			if (i==0) {
				this->setCoeff(1+((2*M_PI*f1)-(2*M_PI*f2))/M_PI,i+int(M/2));
			}else{		
				this->setCoeff(((sin(2*M_PI*f1*i)-sin(2*M_PI*f2*i))/(i*M_PI)),i+int(M/2));
			}
		}
	}
}